

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *target,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  bool bVar1;
  TargetType TVar2;
  mapped_type *pmVar3;
  reference pcVar4;
  cmGeneratorTarget *pcVar5;
  size_t sVar6;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  _Self local_60;
  _Self local_58;
  const_iterator di;
  TargetDependSet *depends;
  size_type local_28;
  size_t count;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  cmGeneratorTarget *target_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_28 = 0;
  emitted_local =
       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        *)target;
  target_local = (cmGeneratorTarget *)this;
  pVar7 = std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(emitted,(value_type *)&emitted_local);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pmVar3 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::operator[](&this->ProgressMap,(key_type *)&emitted_local);
    local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pmVar3->Marks);
    di._M_node = (_Base_ptr)
                 cmGlobalGenerator::GetTargetDirectDepends
                           ((cmGlobalGenerator *)this,(cmGeneratorTarget *)emitted_local);
    local_58._M_node =
         (_Base_ptr)
         std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::begin
                   ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     *)di._M_node);
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                     (di._M_node);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      pcVar4 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_58);
      pcVar5 = cmTargetDepend::operator->(pcVar4);
      TVar2 = cmGeneratorTarget::GetType(pcVar5);
      if (TVar2 != INTERFACE_LIBRARY) {
        pcVar4 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_58);
        pcVar5 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcVar4);
        sVar6 = CountProgressMarksInTarget(this,pcVar5,emitted);
        local_28 = sVar6 + local_28;
      }
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&local_58);
    }
  }
  return local_28;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget(
  cmGeneratorTarget const* target, std::set<cmGeneratorTarget const*>& emitted)
{
  size_t count = 0;
  if (emitted.insert(target).second) {
    count = this->ProgressMap[target].Marks.size();
    TargetDependSet const& depends = this->GetTargetDirectDepends(target);
    for (TargetDependSet::const_iterator di = depends.begin();
         di != depends.end(); ++di) {
      if ((*di)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      count += this->CountProgressMarksInTarget(*di, emitted);
    }
  }
  return count;
}